

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void Js::JavascriptArray::MergeSort<double>
               (double *list,uint32 length,CompareVarsInfo *cvInfo,ArenaAllocator *allocator)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  double *pdVar4;
  ulong uVar5;
  double *pdVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  double local_88;
  CompareVarsInfo *local_80;
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *local_78;
  double *local_70;
  ulong local_68;
  uint local_5c;
  double *local_58;
  double *local_50;
  ulong local_48;
  ulong local_40;
  double local_38;
  double rightElement;
  ulong uVar10;
  
  local_78 = cvInfo->compareType;
  local_80 = cvInfo;
  pdVar4 = Memory::AllocateArray<Memory::ArenaAllocator,double,false>
                     ((Memory *)allocator,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                      (ulong)length);
  local_5c = length * 2;
  local_40 = 1;
  uVar5 = 2;
  local_70 = pdVar4;
  local_50 = list;
  do {
    uVar10 = uVar5;
    uVar9 = (uint)uVar10;
    if (local_5c <= uVar9) {
      return;
    }
    local_68 = local_40;
    for (local_48 = 0; (uint)local_48 < length; local_48 = (ulong)((int)local_48 + uVar9)) {
      uVar7 = (uint)local_48 + (int)local_40;
      if (uVar7 < length) {
        uVar5 = (ulong)(uVar7 - 1);
        local_58 = list + uVar5;
        bVar3 = (*local_78)(local_80,list + uVar7,local_58);
        if (bVar3) {
          uVar7 = (int)local_48 + uVar9;
          uVar8 = (ulong)uVar7;
          if (length <= uVar7) {
            uVar8 = (ulong)length;
          }
          uVar12 = 0xffffffff;
          pdVar6 = pdVar4;
          for (uVar11 = local_68; uVar11 < uVar8; uVar11 = uVar11 + 1) {
            *pdVar6 = list[uVar11];
            uVar12 = (ulong)((int)uVar12 + 1);
            pdVar6 = pdVar6 + 1;
          }
          local_38 = pdVar4[uVar12];
          while( true ) {
            local_88 = *local_58;
            iVar1 = (int)uVar11;
            lVar13 = 0;
            local_58 = (double *)uVar12;
            while( true ) {
              uVar8 = (long)local_58 + lVar13;
              bVar3 = (*local_78)(local_80,&local_38,&local_88);
              iVar2 = (int)lVar13;
              uVar7 = iVar1 + -1 + iVar2;
              if (bVar3) break;
              local_50[uVar7] = local_38;
              if ((int)uVar8 == 0) {
                uVar7 = (iVar2 + iVar1) - 1;
                uVar8 = 0;
                goto LAB_00a6b4b5;
              }
              local_38 = local_70[(uint)((int)uVar12 + -1 + iVar2)];
              lVar13 = lVar13 + -1;
            }
            local_50[uVar7] = local_88;
            if ((uint)uVar5 <= (uint)local_48) break;
            uVar5 = (ulong)((uint)uVar5 - 1);
            local_58 = local_50 + uVar5;
            uVar12 = uVar8 & 0xffffffff;
            uVar11 = (ulong)(uint)(iVar1 + -1 + iVar2);
          }
          uVar7 = (iVar2 + iVar1) - 2;
          local_50[uVar7] = local_38;
LAB_00a6b4b5:
          while( true ) {
            uVar7 = uVar7 - 1;
            bVar3 = uVar8 == 0;
            uVar8 = uVar8 - 1;
            list = local_50;
            pdVar4 = local_70;
            if (bVar3) break;
            local_50[uVar7] = local_70[uVar8];
          }
        }
      }
      local_68 = (ulong)((int)local_68 + uVar9);
    }
    uVar5 = (ulong)(uVar9 * 2);
    local_40 = uVar10;
  } while( true );
}

Assistant:

void JavascriptArray::MergeSort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo, ArenaAllocator* allocator)
    {
        bool (*compareType)(JavascriptArray::CompareVarsInfo*, const void*, const void*) = cvInfo->compareType;
        T* buffer = AnewArray(allocator, T, length);
        uint32 bucketSize = 2, lastSize = 1, position = 0, left = 0, mid = 0, right = 0, i = 0, j = 0, k = 0;
        uint32 doubleLength = length + length;
        T rightElement, leftElement;

        while (bucketSize < doubleLength)
        {
            while (position < length)
            {
                left = position;
                mid = left + lastSize;

                // perform a merge but only if it's necessary
                if (mid < length && compareType (cvInfo, &list[mid], &list[mid - 1]))
                {
                    right = position + bucketSize;
                    right = right < length ? right : length;
                    i = mid - 1, j = 0, k = mid;

                    while (k < right)
                    {
                        buffer[j++] = list[k++];
                    }
    
                    rightElement = buffer[--j];
                    leftElement = list[i];

                    for (;;)
                    {
                        if (compareType (cvInfo, &rightElement, &leftElement))
                        {
                            list[--k] = leftElement;
                            if (i > left)
                            {
                                leftElement = list[--i];
                            }
                            else
                            {
                                list[--k] = rightElement;
                                break;
                            }
                        }
                        else
                        {
                            list[--k] = rightElement;
                            if (j > 0)
                            {
                                rightElement = buffer[--j];
                            }
                            else
                            {
                                break;
                            }
                        }
                    }

                    while (j > 0)
                    {
                        list[--k] = buffer[--j];
                    }
                }  
                position += bucketSize;
            }
            position = 0;
            lastSize = bucketSize;
            bucketSize *= 2;
        }
    }